

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O2

void __thiscall BVFixed::OrComplimented(BVFixed *this,BVFixed *bv)

{
  AssertBV(this,bv);
  for_each<void(BVUnitT<unsigned_long>::*)(BVUnitT<unsigned_long>)>(this,bv,0x60c13a);
  ClearEnd(this);
  return;
}

Assistant:

void
BVFixed::OrComplimented(const BVFixed*bv)
{
    AssertBV(bv);
    this->for_each(bv, &BVUnit::OrComplimented);
    ClearEnd();
}